

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 1005.cpp
# Opt level: O0

int main(void)

{
  int local_14;
  int local_10;
  int q;
  int i;
  
  q = 0;
  std::istream::operator>>((istream *)&std::cin,&n);
  for (local_10 = 0; local_10 < n; local_10 = local_10 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_14);
    std::vector<int,_std::allocator<int>_>::push_back(&a,&local_14);
  }
  f(0,0,0);
  std::ostream::operator<<((ostream *)&std::cout,min_);
  return 0;
}

Assistant:

int main() {
    std::cin >> n;
    for (int i = 0; i < n; ++i) {
        int q;
        std::cin >> q;
        a.push_back(q);
    }
    f(0, 0, 0);
    std::cout << min_;
    return 0;
}